

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_closed_process_io(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  ulong local_1f0;
  uv_stdio_container_t stdio [2];
  uv_write_t write_req;
  uv_pipe_t in;
  
  local_1f0 = eval_b;
  init_process_options("spawn_helper3",exit_cb);
  puVar3 = uv_default_loop();
  uv_pipe_init(puVar3,&in,0);
  options.stdio = stdio;
  stdio[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  options.stdio_count = 1;
  stdio[0].data.stream = (uv_stream_t *)&in;
  close(0);
  puVar3 = uv_default_loop();
  iVar2 = uv_spawn(puVar3,&process,&options);
  eval_a_1 = (int64_t)iVar2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_1f0;
  _eval_b = (uv_buf_t)(auVar1 << 0x40);
  write_req.data = (void *)eval_a_1;
  if ((void *)eval_a_1 == (void *)0x0) {
    _eval_b = uv_buf_init(run_test_spawn_closed_process_io::buffer,0x18);
    iVar2 = uv_write(&write_req,(uv_stream_t *)&in,(uv_buf_t *)&eval_b,1,write_cb);
    eval_a_1 = (int64_t)iVar2;
    eval_b_1 = 0;
    if ((void *)eval_a_1 == (void *)0x0) {
      puVar3 = uv_default_loop();
      iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
      eval_a_1 = (int64_t)iVar2;
      eval_b_1 = 0;
      if ((void *)eval_a_1 == (void *)0x0) {
        eval_a_1 = 1;
        eval_b_1 = (int64_t)exit_cb_called;
        if (eval_b_1 == 1) {
          eval_a_1 = 2;
          eval_b_1 = (int64_t)close_cb_called;
          if (eval_b_1 == 2) {
            puVar3 = uv_default_loop();
            close_loop(puVar3);
            eval_a_1 = 0;
            puVar3 = uv_default_loop();
            iVar2 = uv_loop_close(puVar3);
            eval_b_1 = (int64_t)iVar2;
            if (eval_b_1 == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar6 = "uv_loop_close(uv_default_loop())";
            pcVar5 = "0";
            uVar4 = 0x407;
          }
          else {
            pcVar6 = "close_cb_called";
            pcVar5 = "2";
            uVar4 = 0x405;
          }
        }
        else {
          pcVar6 = "exit_cb_called";
          pcVar5 = "1";
          uVar4 = 0x404;
        }
      }
      else {
        pcVar6 = "0";
        pcVar5 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
        uVar4 = 0x402;
      }
    }
    else {
      pcVar6 = "0";
      pcVar5 = "uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb)";
      uVar4 = 0x400;
    }
  }
  else {
    pcVar6 = "0";
    pcVar5 = "uv_spawn(uv_default_loop(), &process, &options)";
    uVar4 = 0x3fd;
    eval_b_1 = 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar4,pcVar5,"==",pcVar6,eval_a_1,"==",eval_b_1);
  abort();
}

Assistant:

TEST_IMPL(spawn_closed_process_io) {
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  static char buffer[] = "hello-from-spawn_stdin\n";

  init_process_options("spawn_helper3", exit_cb);

  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  close(0); /* Close process stdin. */

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init(buffer, sizeof(buffer));
  ASSERT_OK(uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(2, close_cb_called); /* process, child stdin */

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}